

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL>_>::dispose
          (Own<kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL>_> *this)

{
  SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *object;
  SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *ptrCopy;
  Own<kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL>_> *this_local;
  
  object = this->ptr;
  if (object != (SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *)0x0) {
    this->ptr = (SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *)0x0;
    Disposer::dispose<kj::_::SplitBranch<kj::_::Tuple<int,kj::String,kj::Promise<int>>,2ul>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }